

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O2

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMessage<google::protobuf::json_internal::UnparseProto3Type>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto3Type> *msg,
          Desc<google::protobuf::json_internal::UnparseProto3Type> *desc,bool is_top_level)

{
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 *msg_00;
  bool bVar1;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aVar2;
  undefined8 uVar3;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *msg_01;
  Message *desc_00;
  bool bVar4;
  MessageType MVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  size_t *psVar10;
  Field f;
  size_t sVar11;
  Field pFVar12;
  byte bVar13;
  char *extraout_RDX;
  Status *_status_2;
  char *pcVar14;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *this_00;
  int iVar15;
  int iVar16;
  Status *_status;
  byte c;
  string_view name;
  string_view ws;
  string_view url;
  string_view name_00;
  string_view ws_00;
  size_t sVar17;
  undefined8 uVar18;
  int32_t K;
  StatusOr<int> nanos;
  bool first;
  undefined4 uStack_12c;
  StatusOr<long> secs;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> bytes;
  int32_t hour;
  int32_t min;
  int32_t sec;
  Msg<google::protobuf::json_internal::UnparseProto3Type> *local_98;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> type_url;
  anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
  local_78;
  Message *local_70;
  Field local_68;
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_60;
  string *local_50;
  Field local_48;
  Field local_40;
  anon_union_4_2_a3c22f61_for_StatusOrData<int>_3 local_34;
  
  psVar10 = (size_t *)
            ((ulong)(desc->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ & 0xfffffffffffffffc);
  name._M_str = (char *)msg;
  name._M_len = *psVar10;
  MVar5 = ClassifyMessage((json_internal *)psVar10[1],name);
  switch(MVar5) {
  case kAny:
    pFVar12 = Proto3Type::MustHaveField(desc,1);
    f = Proto3Type::MustHaveField(desc,2);
    sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
    local_98 = msg;
    local_68 = f;
    sVar11 = UnparseProto3Type::GetSize(f,msg);
    if (sVar11 == 0 && sVar17 == 0) {
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{}",2);
      goto LAB_0029af29;
    }
    if (sVar17 == 0) {
      pcVar14 = "broken Any: missing type URL";
      uVar18 = 0x1c;
LAB_0029b056:
      absl::lts_20240722::InvalidArgumentError(this,uVar18,pcVar14);
      return (Status)(uintptr_t)this;
    }
    if ((sVar11 == 0) && ((writer->options_).allow_legacy_syntax == false)) {
      pcVar14 = "broken Any: missing value";
      uVar18 = 0x19;
      goto LAB_0029b056;
    }
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
    writer->indent_ = writer->indent_ + 1;
    UnparseProto3Type::GetString(&type_url,pFVar12,&writer->scratch_buf_,local_98,0);
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&type_url);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      JsonWriter::NewLine(writer);
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"@type\":",8);
      ws._M_str = " ";
      ws._M_len = 1;
      JsonWriter::Whitespace(writer,ws);
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                (&type_url.
                  super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
      local_60.value.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_len =
           type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
           field_1.data_._M_len;
      local_60.value.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_str =
           type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
           field_1.data_._M_str;
      JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>(writer,&local_60);
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                (&type_url.
                  super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&nanos,
                 &type_url.
                  super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_1
                  .data_,(allocator<char> *)&K);
      url._M_str._4_4_ = nanos.super_StatusOrData<int>._12_4_;
      url._M_str._0_4_ = nanos.super_StatusOrData<int>.field_1.data_;
      url._M_len = (size_t)desc->pool_;
      ResolverPool::FindMessage((ResolverPool *)&local_78.status_,url);
      absl::lts_20240722::Status::Status((Status *)this,&local_78.status_);
      if (*(long *)this == 1) {
        absl::lts_20240722::Status::~Status((Status *)this);
        absl::lts_20240722::internal_statusor::
        StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::EnsureOk
                  ((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*> *)
                   &local_78.status_);
        desc_00 = local_70;
        if (sVar11 == 0) {
          bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_0 =
               (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                )0x0;
          bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_1.
          data_._M_len._0_4_ = 0;
        }
        else {
          UnparseProto3Type::GetString(&bytes,local_68,&writer->scratch_buf_,local_98,0);
          absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
          if (*(long *)this != 1) {
            absl::lts_20240722::Status::~Status((Status *)&bytes);
            goto LAB_0029b71c;
          }
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                    (&bytes.
                      super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
          absl::lts_20240722::Status::~Status((Status *)&bytes);
          bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_0 =
               (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                )bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                 field_1.data_._M_str;
        }
        bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_1.
        data_._M_len = (long)bytes.
                             super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                             .field_0 +
                       (long)(int)bytes.
                                  super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                  .field_1.data_._M_len._0_4_;
        bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_1.
        data_._M_str = (char *)0x0;
        UntypedMessage::ParseFromStream
                  ((StatusOr<google::protobuf::json_internal::UntypedMessage> *)&secs,desc_00,
                   (CodedInputStream *)&bytes);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&secs);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::
          StatusOrData<google::protobuf::json_internal::UntypedMessage>::EnsureOk
                    ((StatusOrData<google::protobuf::json_internal::UntypedMessage> *)&secs);
          _first = _first & 0xffffffffffffff00;
          psVar10 = (size_t *)
                    ((ulong)(desc_00->raw_).field_0._impl_.name_.tagged_ptr_.ptr_ &
                    0xfffffffffffffffc);
          name_00._M_str = extraout_RDX;
          name_00._M_len = *psVar10;
          MVar5 = ClassifyMessage((json_internal *)psVar10[1],name_00);
          msg_00 = &secs.super_StatusOrData<long>.field_1;
          if (MVar5 == kNotWellKnown) {
            WriteFields<google::protobuf::json_internal::UnparseProto3Type>
                      (this,writer,(Msg<google::protobuf::json_internal::UnparseProto3Type> *)msg_00
                       ,desc_00,&first);
          }
          else {
            JsonWriter::WriteComma(writer,&first);
            JsonWriter::NewLine(writer);
            io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"value\":",8);
            ws_00._M_str = " ";
            ws_00._M_len = 1;
            JsonWriter::Whitespace(writer,ws_00);
            WriteMessage<google::protobuf::json_internal::UnparseProto3Type>
                      (this,writer,(Msg<google::protobuf::json_internal::UnparseProto3Type> *)msg_00
                       ,desc_00,false);
          }
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            writer->indent_ = writer->indent_ + -1;
            if (first == false) {
              JsonWriter::NewLine(writer);
            }
            io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"}",1);
            *(undefined8 *)this = 1;
          }
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<google::protobuf::json_internal::UntypedMessage>::~StatusOrData
                  ((StatusOrData<google::protobuf::json_internal::UntypedMessage> *)&secs);
        io::CodedInputStream::~CodedInputStream((CodedInputStream *)&bytes);
      }
LAB_0029b71c:
      absl::lts_20240722::Status::~Status(&local_78.status_);
      std::__cxx11::string::~string((string *)&nanos);
    }
    this_00 = &type_url;
    goto LAB_0029b95d;
  case kWrapper:
    pFVar12 = Proto3Type::MustHaveField(desc,1);
    sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
    if (sVar17 == 0) {
      WriteSingular<google::protobuf::json_internal::UnparseProto3Type>(this,writer,pFVar12);
    }
    else {
      (anonymous_namespace)::
      WriteSingular<google::protobuf::json_internal::UnparseProto3Type,google::protobuf::json_internal::UntypedMessage_const&>
                ((_anonymous_namespace_ *)this,writer,pFVar12,msg);
    }
    break;
  case kStruct:
    WriteStructValue<google::protobuf::json_internal::UnparseProto3Type>(this,writer,msg,desc);
    break;
  case kList:
    WriteListValue<google::protobuf::json_internal::UnparseProto3Type>(this,writer,msg,desc);
    break;
  case kValue:
    pFVar12 = Proto3Type::MustHaveField(desc,1);
    sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
    if (sVar17 == 0) {
      pFVar12 = Proto3Type::MustHaveField(desc,2);
      sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
      if (sVar17 == 0) {
        pFVar12 = Proto3Type::MustHaveField(desc,3);
        sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
        if (sVar17 == 0) {
          pFVar12 = Proto3Type::MustHaveField(desc,4);
          sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
          if (sVar17 == 0) {
            pFVar12 = Proto3Type::MustHaveField(desc,5);
            sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
            if (sVar17 != 0) {
              UnparseProto3Type::GetMessage((UnparseProto3Type *)&nanos,pFVar12,msg,0);
              absl::lts_20240722::Status::Status((Status *)this,(Status *)&nanos);
              if (*(long *)this == 1) {
                absl::lts_20240722::Status::~Status((Status *)this);
                ResolverPool::Field::MessageType((Field *)&bytes);
                absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
                if (*(long *)this == 1) {
                  absl::lts_20240722::Status::~Status((Status *)this);
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::
                  EnsureOk((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                            *)&bytes);
                  absl::lts_20240722::internal_statusor::
                  StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::EnsureOk
                            ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>
                              *)&nanos);
                  WriteStructValue<google::protobuf::json_internal::UnparseProto3Type>
                            (this,writer,
                             (Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                             CONCAT44(nanos.super_StatusOrData<int>._12_4_,
                                      nanos.super_StatusOrData<int>.field_1.data_),
                             (Desc<google::protobuf::json_internal::UnparseProto3Type> *)
                             bytes.
                             super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                             .field_1.data_._M_len);
                }
                absl::lts_20240722::Status::~Status((Status *)&bytes);
              }
              absl::lts_20240722::Status::~Status((Status *)&nanos);
              return (Status)(uintptr_t)this;
            }
            pFVar12 = Proto3Type::MustHaveField(desc,6);
            sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
            if (sVar17 == 0) {
              if (!is_top_level) {
                absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&bytes,
                           "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/json/internal/unparser.cc"
                           ,0x22b,0xc,"is_top_level");
                absl::lts_20240722::log_internal::LogMessage::operator<<
                          ((LogMessage *)&bytes,
                           (char (*) [130])
                           "empty, non-top-level Value must be handled one layer up, since it prints an empty string; reaching this statement is always a bug"
                          );
                absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                          ((LogMessageFatal *)&bytes);
              }
              goto LAB_0029af29;
            }
            UnparseProto3Type::GetMessage((UnparseProto3Type *)&nanos,pFVar12,msg,0);
            absl::lts_20240722::Status::Status((Status *)this,(Status *)&nanos);
            if (*(long *)this == 1) {
              absl::lts_20240722::Status::~Status((Status *)this);
              ResolverPool::Field::MessageType((Field *)&bytes);
              absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
              if (*(long *)this == 1) {
                absl::lts_20240722::Status::~Status((Status *)this);
                absl::lts_20240722::internal_statusor::
                StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>::
                EnsureOk((StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>
                          *)&bytes);
                uVar18 = bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len;
                absl::lts_20240722::internal_statusor::
                StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>::EnsureOk
                          ((StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*> *)
                           &nanos);
                WriteListValue<google::protobuf::json_internal::UnparseProto3Type>
                          (this,writer,
                           (Msg<google::protobuf::json_internal::UnparseProto3Type> *)
                           CONCAT44(nanos.super_StatusOrData<int>._12_4_,
                                    nanos.super_StatusOrData<int>.field_1.data_),
                           (Desc<google::protobuf::json_internal::UnparseProto3Type> *)uVar18);
              }
              absl::lts_20240722::Status::~Status((Status *)&bytes);
            }
            this_00 = (StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&nanos;
            goto LAB_0029b95d;
          }
          UnparseProto3Type::GetBool((UnparseProto3Type *)&bytes,pFVar12,msg,0);
          absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            absl::lts_20240722::internal_statusor::StatusOrData<bool>::EnsureOk
                      ((StatusOrData<bool> *)&bytes);
            pcVar14 = "false";
            if ((bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                 field_1.data_._M_len & 0xff) != 0) {
              pcVar14 = "true";
            }
            io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                      (&writer->sink_,pcVar14,
                       bytes.
                       super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                       field_1.data_._M_len & 0xff ^ 5);
            *(undefined8 *)this = 1;
          }
        }
        else {
          UnparseProto3Type::GetString(&bytes,pFVar12,&writer->scratch_buf_,msg,0);
          absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            absl::lts_20240722::internal_statusor::
            StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                      (&bytes.
                        super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
            secs.super_StatusOrData<long>.field_0 =
                 (anon_union_8_1_1246618d_for_StatusOrData<long>_1)
                 bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                 field_1.data_._M_len;
            secs.super_StatusOrData<long>.field_1 =
                 (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
                 bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                 field_1.data_._M_str;
            JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                      (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              &secs);
            *(undefined8 *)this = 1;
          }
        }
      }
      else {
        UnparseProto3Type::GetDouble((UnparseProto3Type *)&bytes,pFVar12,msg,0);
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&bytes);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                    ((StatusOrData<double> *)&bytes);
          if (NAN((double)bytes.
                          super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                          .field_1.data_._M_len)) {
            pcVar14 = 
            "google.protobuf.Value cannot encode double values for nan, because it would be parsed as a string"
            ;
            uVar18 = 0x61;
          }
          else {
            absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                      ((StatusOrData<double> *)&bytes);
            pcVar14 = 
            "google.protobuf.Value cannot encode double values for infinity, because it would be parsed as a string"
            ;
            uVar18 = 0x66;
            if (((double)bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len < INFINITY) &&
               (absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                          ((StatusOrData<double> *)&bytes),
               -INFINITY <
               (double)bytes.
                       super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                       field_1.data_._M_len)) {
              absl::lts_20240722::internal_statusor::StatusOrData<double>::EnsureOk
                        ((StatusOrData<double> *)&bytes);
              JsonWriter::Write(writer,(double)bytes.
                                               super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                               .field_1.data_._M_len);
              *(undefined8 *)this = 1;
              goto LAB_0029b0f5;
            }
          }
          absl::lts_20240722::InvalidArgumentError(this,uVar18,pcVar14);
        }
      }
LAB_0029b0f5:
      this_00 = &bytes;
      goto LAB_0029b95d;
    }
    pcVar14 = "null";
    sVar17 = 4;
    goto LAB_0029acdd;
  default:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
    writer->indent_ = writer->indent_ + 1;
    bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_0.status_
    .rep_._0_1_ = 1;
    WriteFields<google::protobuf::json_internal::UnparseProto3Type>
              (this,writer,msg,desc,(bool *)&bytes);
    if (*(long *)this != 1) {
      return (Status)(uintptr_t)this;
    }
    absl::lts_20240722::Status::~Status((Status *)this);
    writer->indent_ = writer->indent_ + -1;
    if (bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.field_0.
        status_.rep_._0_1_ == '\0') {
      JsonWriter::NewLine(writer);
    }
    pcVar14 = "}";
    sVar17 = 1;
LAB_0029acdd:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,pcVar14,sVar17);
LAB_0029af29:
    *(undefined8 *)this = 1;
    break;
  case kTimestamp:
    pFVar12 = Proto3Type::MustHaveField(desc,1);
    sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
    if (sVar17 == 0) {
      secs.super_StatusOrData<long>.field_1.data_ = 0;
      secs.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    }
    else {
      UnparseProto3Type::GetInt64((UnparseProto3Type *)&secs,pFVar12,msg,0);
    }
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&secs);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                (&secs.super_StatusOrData<long>);
      if ((long)secs.super_StatusOrData<long>.field_1 < -0xe7791f700) {
        pcVar14 = "minimum acceptable time value is 0001-01-01T00:00:00Z";
      }
      else {
        absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                  (&secs.super_StatusOrData<long>);
        if (secs.super_StatusOrData<long>.field_1.data_ < 0x3afff44180) {
          absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                    (&secs.super_StatusOrData<long>);
          secs.super_StatusOrData<long>.field_1.data_ =
               secs.super_StatusOrData<long>.field_1.data_ + 0xe7791f700;
          pFVar12 = Proto3Type::MustHaveField(desc,2);
          sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
          if (sVar17 == 0) {
            nanos.super_StatusOrData<int>.field_1.data_ = 0;
            nanos.super_StatusOrData<int>.field_0 =
                 (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
          }
          else {
            UnparseProto3Type::GetInt32((UnparseProto3Type *)&nanos,pFVar12,msg,0);
          }
          absl::lts_20240722::Status::Status((Status *)this,(Status *)&nanos);
          if (*(long *)this == 1) {
            absl::lts_20240722::Status::~Status((Status *)this);
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&secs.super_StatusOrData<long>);
            iVar7 = (int)(secs.super_StatusOrData<long>.field_1.data_ / 0x15180);
            iVar6 = (iVar7 * 4 + 0x6d40ac) / 0x23ab1;
            iVar16 = (iVar6 * 0x23ab1 + 3) / -4 + iVar7 + 0x1b502b;
            iVar7 = (iVar16 * 4000 + 4000) / 0x164b09;
            iVar8 = (iVar7 * 0x5b5) / -4;
            iVar15 = (iVar8 + iVar16 + 0x1f) * 0x50;
            iVar9 = iVar15 / 0x98f;
            K = (iVar9 * 0x98f) / -0x50 + iVar16 + iVar8 + 0x1f;
            iVar15 = iVar15 / 0x6925;
            _first = iVar15 * -0xc + iVar9 + 2;
            local_60.value.
            super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
            super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
            _M_head_impl._M_len =
                 CONCAT44(local_60.value.
                          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          .
                          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                          ._M_head_impl._M_len._4_4_,iVar15 + iVar6 * 100 + iVar7 + -0x1324);
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&secs.super_StatusOrData<long>);
            sec = (int32_t)(secs.super_StatusOrData<long>.field_1.data_ % 0x3c);
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&secs.super_StatusOrData<long>);
            min = (int32_t)((secs.super_StatusOrData<long>.field_1.data_ / 0x3c) % 0x3c);
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&secs.super_StatusOrData<long>);
            hour = (int32_t)((secs.super_StatusOrData<long>.field_1.data_ / 0xe10) % 0x18);
            absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                      (&nanos.super_StatusOrData<int>);
            if (nanos.super_StatusOrData<int>.field_1.data_ == 0) {
              type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                         )anon_var_dwarf_760f59;
              type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_1.data_._M_len = 0x20;
              absl::lts_20240722::StrFormat<int,_int,_int,_int,_int,_int>
                        ((string *)&bytes,(FormatSpec<int,_int,_int,_int,_int,_int> *)&type_url,
                         (int *)&local_60,(int *)&first,&K,&hour,&min,&sec);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,
                         (char *)bytes.
                                 super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                 .field_0,
                         bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len);
            }
            else {
              absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                        (&nanos.super_StatusOrData<int>);
              local_34.data_ = -nanos.super_StatusOrData<int>.field_1.data_;
              if (0 < nanos.super_StatusOrData<int>.field_1.data_) {
                local_34 = nanos.super_StatusOrData<int>.field_1;
              }
              local_78 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
                          )0x9;
              while ((uint)local_34.data_ % 1000 == 0) {
                local_78 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
                            )((long)local_78 + -3);
                local_34.data_ = local_34.data_ / 1000;
              }
              type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                         )anon_var_dwarf_760f73;
              type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_1.data_._M_len = 0x25;
              absl::lts_20240722::
              StrFormat<int,_int,_int,_int,_int,_int,_unsigned_long,_unsigned_int>
                        ((string *)&bytes,
                         (FormatSpec<int,_int,_int,_int,_int,_int,_unsigned_long,_unsigned_int> *)
                         &type_url,(int *)&local_60,(int *)&first,&K,&hour,&min,&sec,
                         (unsigned_long *)&local_78,(uint *)&local_34.data_);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,
                         (char *)bytes.
                                 super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                 .field_0,
                         bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len);
            }
            std::__cxx11::string::~string((string *)&bytes);
            *(undefined8 *)this = 1;
          }
          absl::lts_20240722::Status::~Status((Status *)&nanos);
          goto LAB_0029b958;
        }
        pcVar14 = "maximum acceptable time value is 9999-12-31T23:59:59Z";
      }
      absl::lts_20240722::InvalidArgumentError(this,0x35,pcVar14);
    }
    goto LAB_0029b958;
  case kDuration:
    pFVar12 = Proto3Type::MustHaveField(desc,1);
    sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
    if (sVar17 == 0) {
      secs.super_StatusOrData<long>.field_1.data_ = 0;
      secs.super_StatusOrData<long>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<long>_1)0x1;
    }
    else {
      UnparseProto3Type::GetInt64((UnparseProto3Type *)&secs,pFVar12,msg,0);
    }
    absl::lts_20240722::Status::Status((Status *)this,(Status *)&secs);
    if (*(long *)this == 1) {
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                (&secs.super_StatusOrData<long>);
      if ((secs.super_StatusOrData<long>.field_1.data_ < 0x4979cb9e01) &&
         (absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                    (&secs.super_StatusOrData<long>),
         -0x4979cb9e01 < secs.super_StatusOrData<long>.field_1.data_)) {
        pFVar12 = Proto3Type::MustHaveField(desc,2);
        sVar17 = UnparseProto3Type::GetSize(pFVar12,msg);
        if (sVar17 == 0) {
          nanos.super_StatusOrData<int>.field_1.data_ = 0;
          nanos.super_StatusOrData<int>.field_0 =
               (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
        }
        else {
          UnparseProto3Type::GetInt32((UnparseProto3Type *)&nanos,pFVar12,msg,0);
        }
        absl::lts_20240722::Status::Status((Status *)this,(Status *)&nanos);
        if (*(long *)this == 1) {
          absl::lts_20240722::Status::~Status((Status *)this);
          absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                    (&nanos.super_StatusOrData<int>);
          pcVar14 = "duration out of range";
          uVar18 = 0x15;
          if ((nanos.super_StatusOrData<int>.field_1.data_ < 1000000000) &&
             (absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                        (&nanos.super_StatusOrData<int>),
             -1000000000 < nanos.super_StatusOrData<int>.field_1.data_)) {
            absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                      (&secs.super_StatusOrData<long>);
            if ((secs.super_StatusOrData<long>.field_1.data_ != 0) &&
               (absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                          (&nanos.super_StatusOrData<int>),
               nanos.super_StatusOrData<int>.field_1.data_ != 0)) {
              absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                        (&secs.super_StatusOrData<long>);
              aVar2 = secs.super_StatusOrData<long>.field_1;
              absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                        (&nanos.super_StatusOrData<int>);
              if ((uint)nanos.super_StatusOrData<int>.field_1.data_ >> 0x1f !=
                  -(int)(aVar2.data_ >> 0x3f)) {
                pcVar14 = "nanos and seconds signs do not match";
                uVar18 = 0x24;
                goto LAB_0029b164;
              }
            }
            absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                      (&nanos.super_StatusOrData<int>);
            if (nanos.super_StatusOrData<int>.field_1.data_ == 0) {
              type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                         )anon_var_dwarf_760fa5;
              type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_1.data_._M_len = 5;
              absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                        (&secs.super_StatusOrData<long>);
              absl::lts_20240722::StrFormat<long>
                        ((string *)&bytes,(FormatSpec<long> *)&type_url,
                         &secs.super_StatusOrData<long>.field_1.data_);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,
                         (char *)bytes.
                                 super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                 .field_0,
                         bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len);
            }
            else {
              absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                        (&nanos.super_StatusOrData<int>);
              K = -nanos.super_StatusOrData<int>.field_1.data_;
              if (0 < nanos.super_StatusOrData<int>.field_1.data_) {
                K = (int32_t)nanos.super_StatusOrData<int>.field_1;
              }
              local_60.value.
              super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
              super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
              _M_head_impl._M_len = 9;
              while ((uint)K % 1000 == 0) {
                local_60.value.
                super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
                _M_head_impl._M_len =
                     local_60.value.
                     super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                     super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                     ._M_head_impl._M_len - 3;
                K = (uint)K / 1000;
              }
              absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                        (&secs.super_StatusOrData<long>);
              if (secs.super_StatusOrData<long>.field_1.data_ < 0) {
                pcVar14 = "-";
              }
              else {
                absl::lts_20240722::internal_statusor::StatusOrData<int>::EnsureOk
                          (&nanos.super_StatusOrData<int>);
                pcVar14 = "";
                if (nanos.super_StatusOrData<int>.field_1.data_ < 0) {
                  pcVar14 = "-";
                }
              }
              type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_0 = (anon_union_8_1_1246618d_for_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>_1
                         )strlen(pcVar14);
              local_78 = (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::ResolverPool::Message_*>_1
                          )0x3b63c9;
              local_70 = (Message *)0xc;
              type_url.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_1.data_._M_len = (size_t)pcVar14;
              absl::lts_20240722::internal_statusor::StatusOrData<long>::EnsureOk
                        (&secs.super_StatusOrData<long>);
              _first = -secs.super_StatusOrData<long>.field_1.data_;
              if (0 < secs.super_StatusOrData<long>.field_1.data_) {
                _first = secs.super_StatusOrData<long>.field_1;
              }
              absl::lts_20240722::
              StrFormat<std::basic_string_view<char,_std::char_traits<char>_>,_long,_unsigned_long,_unsigned_int>
                        ((string *)&bytes,
                         (FormatSpec<std::basic_string_view<char>,_long,_unsigned_long,_unsigned_int>
                          *)&local_78.status_,
                         (basic_string_view<char,_std::char_traits<char>_> *)&type_url,
                         (long *)&first,(unsigned_long *)&local_60,(uint *)&K);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                        (&writer->sink_,
                         (char *)bytes.
                                 super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>
                                 .field_0,
                         bytes.
                         super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
                         field_1.data_._M_len);
            }
            std::__cxx11::string::~string((string *)&bytes);
            *(undefined8 *)this = 1;
          }
          else {
LAB_0029b164:
            absl::lts_20240722::InvalidArgumentError(this,uVar18,pcVar14);
          }
        }
        absl::lts_20240722::Status::~Status((Status *)&nanos);
      }
      else {
        absl::lts_20240722::InvalidArgumentError(this,0x15,"duration out of range");
      }
    }
LAB_0029b958:
    this_00 = (StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&secs;
LAB_0029b95d:
    absl::lts_20240722::Status::~Status((Status *)this_00);
    break;
  case kFieldMask:
    local_48 = Proto3Type::MustHaveField(desc,1);
    local_40 = (Field)UnparseProto3Type::GetSize(local_48,msg);
    JsonWriter::Write(writer,'\"');
    secs.super_StatusOrData<long>.field_0.status_.rep_._0_1_ = 1;
    local_50 = &writer->scratch_buf_;
    pFVar12 = (Field)0x0;
    local_98 = msg;
    while (msg_01 = local_98, pFVar12 != local_40) {
      JsonWriter::WriteComma(writer,(bool *)&secs);
      UnparseProto3Type::GetString
                ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                 &bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>,
                 local_48,local_50,msg_01,(size_t)pFVar12);
      absl::lts_20240722::Status::Status
                ((Status *)this,
                 (Status *)
                 &bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
      if (*(long *)this != 1) goto LAB_0029b0f5;
      local_68 = pFVar12;
      absl::lts_20240722::Status::~Status((Status *)this);
      absl::lts_20240722::internal_statusor::
      StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::EnsureOk
                (&bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
      uVar3 = bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
              field_1.data_._M_str;
      uVar18 = bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>.
               field_1.data_._M_len;
      bVar1 = false;
      for (sVar17 = 0; uVar18 != sVar17; sVar17 = sVar17 + 1) {
        c = *(byte *)(uVar3 + sVar17);
        if ((byte)(c + 0x9f) < 0x1a) {
          if (bVar1) {
            c = *(byte *)((long)&absl::lts_20240722::ascii_internal::kToUpper + (ulong)c);
          }
LAB_0029ac49:
          JsonWriter::Write(writer,c);
          bVar4 = false;
        }
        else {
          if (c == 0x2e || (byte)(c - 0x30) < 10) goto LAB_0029ac49;
          if (c != 0x5f) {
            bVar13 = (writer->options_).allow_legacy_syntax;
LAB_0029ac31:
            if ((bVar13 & 1) != 0) {
              if (bVar1) {
                JsonWriter::Write(writer,'_');
              }
              goto LAB_0029ac49;
            }
            absl::lts_20240722::InvalidArgumentError(this,0x21,"unexpected character in FieldMask");
            goto LAB_0029b0f5;
          }
          bVar4 = true;
          if ((bVar1) && (bVar13 = (writer->options_).allow_legacy_syntax, (bool)bVar13 == false))
          goto LAB_0029ac31;
        }
        bVar1 = bVar4;
      }
      absl::lts_20240722::Status::~Status
                ((Status *)
                 &bytes.super_StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>);
      pFVar12 = (Field)((long)&local_68->pool_ + 1);
    }
    JsonWriter::Write(writer,'\"');
    goto LAB_0029af29;
  }
  return (Status)(uintptr_t)this;
}

Assistant:

absl::Status WriteMessage(JsonWriter& writer, const Msg<Traits>& msg,
                          const Desc<Traits>& desc, bool is_top_level) {
  switch (ClassifyMessage(Traits::TypeName(desc))) {
    case MessageType::kAny:
      return WriteAny<Traits>(writer, msg, desc);
    case MessageType::kWrapper: {
      auto field = Traits::MustHaveField(desc, 1);
      if (Traits::GetSize(field, msg) == 0) {
        return WriteSingular<Traits>(writer, field);
      }
      return WriteSingular<Traits>(writer, field, msg);
    }
    case MessageType::kValue:
      return WriteValue<Traits>(writer, msg, desc, is_top_level);
    case MessageType::kStruct:
      return WriteStructValue<Traits>(writer, msg, desc);
    case MessageType::kList:
      return WriteListValue<Traits>(writer, msg, desc);
    case MessageType::kTimestamp:
      return WriteTimestamp<Traits>(writer, msg, desc);
    case MessageType::kDuration:
      return WriteDuration<Traits>(writer, msg, desc);
    case MessageType::kFieldMask:
      return WriteFieldMask<Traits>(writer, msg, desc);
    default: {
      writer.Write("{");
      writer.Push();
      bool first = true;
      RETURN_IF_ERROR(WriteFields<Traits>(writer, msg, desc, first));
      writer.Pop();
      if (!first) {
        writer.NewLine();
      }
      writer.Write("}");
      return absl::OkStatus();
    }
  }
}